

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismExtend.cpp
# Opt level: O0

int pztopology::Pr<pztopology::TPZPoint>::SideNodeLocId(int side,int node)

{
  int side_00;
  int iVar1;
  ostream *poVar2;
  void *this;
  int in_ESI;
  int in_EDI;
  int fatherlevel;
  int fatherside;
  int ftns;
  int local_4;
  
  side_00 = in_EDI % 1;
  if (in_EDI / 1 == 0) {
    local_4 = TPZPoint::SideNodeLocId(in_EDI,in_ESI);
  }
  else if (in_EDI / 1 == 1) {
    local_4 = TPZPoint::SideNodeLocId(in_EDI + -1,in_ESI);
    local_4 = local_4 + 1;
  }
  else {
    iVar1 = TPZPoint::NSideNodes(side_00);
    if (in_ESI / iVar1 == 0) {
      local_4 = TPZPoint::SideNodeLocId(side_00,in_ESI);
    }
    else if (in_ESI / iVar1 == 1) {
      iVar1 = TPZPoint::NSideNodes(side_00);
      local_4 = TPZPoint::SideNodeLocId(side_00,in_ESI - iVar1);
      local_4 = local_4 + 1;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "Pr<TFather>::SideNodeLocId inconsistent side or node ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_EDI);
      poVar2 = std::operator<<(poVar2,' ');
      this = (void *)std::ostream::operator<<(poVar2,in_ESI);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int Pr<TFather>::SideNodeLocId(int side, int node)
	{
		int ftns = side/TFather::NSides;
		int fatherside = side%TFather::NSides;
		if(ftns == 0) return TFather::SideNodeLocId(side,node);
		if(ftns == 1) return TFather::SideNodeLocId(side-TFather::NSides,node)+TFather::NCornerNodes;
		int fatherlevel = node/TFather::NSideNodes(fatherside);
		if(fatherlevel == 0) return TFather::SideNodeLocId(fatherside,node);
		if(fatherlevel == 1) return TFather::SideNodeLocId(fatherside,node-TFather::NSideNodes(fatherside))+TFather::NCornerNodes;//TFather::NSideNodes(fatherside);
		PZError << "Pr<TFather>::SideNodeLocId inconsistent side or node " << side
		<< ' ' << node << endl;
		return -1;
	}